

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_> * __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::createWallet
          (Result<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
           *__return_storage_ptr__,WalletLoaderImpl *this,string *name,SecureString *passphrase,
          uint64_t wallet_creation_flags,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  __index_type _Var5;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> local_120;
  long local_110;
  DatabaseStatus status;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  bilingual_str error;
  DatabaseOptions options;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  options.require_existing = false;
  options.require_create = false;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
  options.create_flags = 0;
  options.create_passphrase._M_dataplus._M_p = (pointer)&options.create_passphrase.field_2;
  options.create_passphrase._M_string_length = 0;
  options.create_passphrase.field_2._M_local_buf[0] = '\0';
  options.verify = true;
  options.use_unsafe_sync = false;
  options.use_shared_memory = false;
  options.max_log_mb = 100;
  ReadDatabaseArgs((this->m_context).args,&options);
  options.require_create = true;
  options.create_flags = wallet_creation_flags;
  _GLOBAL__N_1::std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
  _M_assign((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)
            &options.create_passphrase,
            (basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)passphrase);
  paVar2 = &error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  paVar3 = &error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  error.original._M_dataplus._M_p = (pointer)paVar2;
  error.translated._M_dataplus._M_p = (pointer)paVar3;
  CreateWallet((wallet *)&local_120,&this->m_context,(string *)name,(optional<bool>)0x101,&options,
               &status,&error,(vector<bilingual_str,_std::allocator<bilingual_str>_> *)warnings);
  interfaces::MakeWallet((interfaces *)&local_110,&this->m_context,&local_120);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_120.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_120.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_110 == 0) {
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,error.original._M_dataplus._M_p,
               error.original._M_dataplus._M_p + error.original._M_string_length);
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,error.translated._M_dataplus._M_p,
               error.translated._M_dataplus._M_p + error.translated._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                     .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
      .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
      super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> = puVar1;
    if (local_100 == &local_f0) {
      *puVar1 = CONCAT71(uStack_ef,local_f0);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
               .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
       0x18) = uStack_e8;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
        .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
        super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> =
           local_100;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                        .
                        super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                + 0x10) = CONCAT71(uStack_ef,local_f0);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> + 8)
         = local_f8;
    local_f8 = 0;
    local_f0 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                     .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
                     super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
             + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x20) = puVar1;
    if (local_e0 == &local_d0) {
      *puVar1 = CONCAT71(uStack_cf,local_d0);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
               .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
       0x38) = uStack_c8;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
               .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
               super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
       0x20) = local_e0;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
                        .
                        super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>
                + 0x30) = CONCAT71(uStack_cf,local_d0);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
             .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
             super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> +
     0x28) = local_d8;
    local_d8 = 0;
    local_d0 = 0;
    _Var5 = '\0';
    local_100 = &local_f0;
    local_e0 = &local_d0;
  }
  else {
    *(long *)&(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
              .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
              super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> =
         local_110;
    _Var5 = '\x01';
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>
           .super__Move_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
           super__Copy_assign_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
           super__Move_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
           super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_>.
           super__Variant_storage_alias<bilingual_str,_std::unique_ptr<interfaces::Wallet>_> + 0x40)
       = _Var5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.translated._M_dataplus._M_p != paVar3) {
    operator_delete(error.translated._M_dataplus._M_p,
                    CONCAT71(error.translated.field_2._M_allocated_capacity._1_7_,
                             error.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.original._M_dataplus._M_p != paVar2) {
    operator_delete(error.original._M_dataplus._M_p,
                    CONCAT71(error.original.field_2._M_allocated_capacity._1_7_,
                             error.original.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)options.create_passphrase._M_dataplus._M_p != &options.create_passphrase.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              (&options.create_passphrase,
               CONCAT71(options.create_passphrase.field_2._M_allocated_capacity._1_7_,
                        options.create_passphrase.field_2._M_local_buf[0]));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<std::unique_ptr<Wallet>> createWallet(const std::string& name, const SecureString& passphrase, uint64_t wallet_creation_flags, std::vector<bilingual_str>& warnings) override
    {
        DatabaseOptions options;
        DatabaseStatus status;
        ReadDatabaseArgs(*m_context.args, options);
        options.require_create = true;
        options.create_flags = wallet_creation_flags;
        options.create_passphrase = passphrase;
        bilingual_str error;
        std::unique_ptr<Wallet> wallet{MakeWallet(m_context, CreateWallet(m_context, name, /*load_on_start=*/true, options, status, error, warnings))};
        if (wallet) {
            return wallet;
        } else {
            return util::Error{error};
        }
    }